

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void colmajor_to_rowmajor<double>
               (double *X,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *X_row_major)

{
  pointer pdVar1;
  size_t sVar2;
  pointer pdVar3;
  size_t sVar4;
  
  std::vector<double,_std::allocator<double>_>::resize(X_row_major,ncols * nrows);
  if (nrows != 0) {
    pdVar1 = (X_row_major->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = 0;
    do {
      if (ncols != 0) {
        sVar4 = 0;
        pdVar3 = pdVar1;
        do {
          *pdVar3 = X[sVar4];
          sVar4 = sVar4 + 1;
          pdVar3 = pdVar3 + nrows;
        } while (ncols != sVar4);
      }
      sVar2 = sVar2 + 1;
      X = X + ncols;
      pdVar1 = pdVar1 + 1;
    } while (sVar2 != nrows);
  }
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict X, size_t nrows, size_t ncols, std::vector<double> &X_row_major)
{
    X_row_major.resize(nrows * ncols);
    for (size_t row = 0; row < nrows; row++)
        for (size_t col = 0; col < ncols; col++)
            X_row_major[row + col*nrows] = X[col + row*ncols];
}